

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestResults.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_3dd33::TestRecordsNumberOfFailures::RunImpl(TestRecordsNumberOfFailures *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  TestResults results;
  int local_58 [2];
  TestDetails local_50;
  TestResults local_30;
  
  UnitTest::TestResults::TestResults(&local_30,(TestReporter *)0x0);
  UnitTest::TestResults::OnTestFailure(&local_30,(TestDetails *)(anonymous_namespace)::details,"");
  UnitTest::TestResults::OnTestFailure(&local_30,(TestDetails *)(anonymous_namespace)::details,"");
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_58[1] = 2;
  local_58[0] = UnitTest::TestResults::GetFailureCount(&local_30);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_50,*ppTVar2,0x26);
  UnitTest::CheckEqual<int,int>(results_00,local_58 + 1,local_58,&local_50);
  return;
}

Assistant:

TEST(RecordsNumberOfFailures)
{
    TestResults results;
    results.OnTestFailure(details, "");
    results.OnTestFailure(details, "");
    CHECK_EQUAL(2, results.GetFailureCount());
}